

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_concat(lua_State *L,int total)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  TString *pTVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  StkId obj;
  ulong l;
  StkId top;
  char buff [40];
  
  if (total != 1) {
    top = (L->top).p;
    do {
      if ((byte)((*(byte *)((long)top + -0x18) & 0xf) - 3) < 2) {
        bVar2 = *(byte *)((long)top + -8);
        if ((bVar2 & 0xf) != 4) {
          if ((bVar2 & 0xf) != 3) goto LAB_0014bdc7;
          luaO_tostring(L,&top[-1].val);
          bVar2 = *(byte *)((long)top + -8);
        }
        obj = top + -2;
        if (bVar2 == 0x44) {
          bVar5 = *(byte *)((long)top + -0x18);
          if (top[-1].val.value_.f[0xb] != (_func_int_lua_State_ptr)0x0) goto LAB_0014bddc;
          iVar7 = 1;
          if ((bVar5 & 0xf) == 3) {
            luaO_tostring(L,&obj->val);
            goto LAB_0014bdcf;
          }
        }
        else {
          bVar5 = *(byte *)((long)top + -0x18);
LAB_0014bddc:
          if ((bVar5 == 0x44) && ((obj->val).value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
            top[-2].val.value_ = top[-1].val.value_;
            *(byte *)((long)top + -0x18) = bVar2;
            goto LAB_0014bdcf;
          }
          lVar1 = *(long *)(top + -1);
          l = (ulong)*(byte *)(lVar1 + 0xb);
          if (l == 0xff) {
            l = *(ulong *)(lVar1 + 0x10);
          }
          uVar8 = 1;
          if (1 < total) {
            uVar8 = (ulong)(uint)total;
          }
          for (uVar6 = 1; (long)uVar6 < (long)total; uVar6 = uVar6 + 1) {
            bVar2 = (obj->val).tt_ & 0xf;
            if (bVar2 != 4) {
              if (bVar2 != 3) {
                uVar8 = uVar6 & 0xffffffff;
                break;
              }
              luaO_tostring(L,&obj->val);
            }
            uVar3 = (ulong)*(byte *)(*(long *)obj + 0xb);
            if (uVar3 == 0xff) {
              uVar3 = *(ulong *)(*(long *)obj + 0x10);
            }
            if (0x7fffffffffffffdf - l <= uVar3) {
              (L->top).p = top + -(long)total;
              luaG_runerror(L,"string length overflow");
            }
            l = l + uVar3;
            obj = obj + -1;
          }
          iVar7 = (int)uVar8;
          if (l < 0x29) {
            copy2buff(top,iVar7,buff);
            pTVar4 = luaS_newlstr(L,buff,l);
          }
          else {
            pTVar4 = luaS_createlngstrobj(L,l);
            copy2buff(top,iVar7,pTVar4->contents);
          }
          *(TString **)(top + -uVar8) = pTVar4;
          top[-uVar8].val.tt_ = pTVar4->tt | 0x40;
          iVar7 = iVar7 + -1;
        }
      }
      else {
LAB_0014bdc7:
        luaT_tryconcatTM(L);
LAB_0014bdcf:
        iVar7 = 1;
      }
      total = total - iVar7;
      top = (L->top).p + -(long)iVar7;
      (L->top).p = top;
    } while (1 < total);
  }
  return;
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  if (total == 1)
    return;  /* "all" values already concatenated */
  do {
    StkId top = L->top.p;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(s2v(top - 2)) || cvt2str(s2v(top - 2))) ||
        !tostring(L, s2v(top - 1)))
      luaT_tryconcatTM(L);  /* may invalidate 'top' */
    else if (isemptystr(s2v(top - 1)))  /* second operand is empty? */
      cast_void(tostring(L, s2v(top - 2)));  /* result is first operand */
    else if (isemptystr(s2v(top - 2))) {  /* first operand is empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsslen(tsvalue(s2v(top - 1)));
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, s2v(top - n - 1)); n++) {
        size_t l = tsslen(tsvalue(s2v(top - n - 1)));
        if (l_unlikely(l >= MAX_SIZE - sizeof(TString) - tl)) {
          L->top.p = top - total;  /* pop strings to avoid wasting stack */
          luaG_runerror(L, "string length overflow");
        }
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getlngstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n - 1;  /* got 'n' strings to create one new */
    L->top.p -= n - 1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}